

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatements
          (cmNinjaTargetGenerator *this,string *config,string *fileConfig,bool firstForConfig)

{
  pointer *pppcVar1;
  cmCustomCommand *cc_00;
  string_view str;
  undefined8 this_00;
  pointer cc_01;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  TargetType targetType;
  PolicyStatus PVar5;
  cmFileSetVisibility vis;
  cmGeneratedFileStream *pcVar6;
  ostream *poVar7;
  cmGeneratorTarget *pcVar8;
  string *psVar9;
  pointer pcVar10;
  mapped_type *pmVar11;
  pointer pMVar12;
  cmMakefile *pcVar13;
  cmGlobalNinjaGenerator *pcVar14;
  reference ppcVar15;
  const_iterator __first;
  const_iterator __last;
  reference pbVar16;
  cmSourceFile *sf_00;
  cmLocalNinjaGenerator *pcVar17;
  reference ppcVar18;
  reference ppcVar19;
  string *args_1;
  size_type sVar20;
  vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
  *this_01;
  reference lang;
  ulong uVar21;
  pointer *ppbVar22;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var23;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool local_109a;
  bool local_f82;
  bool local_f79;
  char local_df1;
  string local_df0;
  reference local_dd0;
  string *l_1;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  string local_da8;
  reference local_d88;
  string *l;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  LinkedTargetDirs linked_directories;
  ScanningFiles *scanFiles;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>
  *__range2_1;
  char local_cf1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  char local_ca9;
  string local_ca8;
  string local_c88;
  string local_c68;
  undefined1 local_c48 [8];
  cmNinjaBuild build_1;
  vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>
  *scanningFiles;
  string *language;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>
  *langScanningFiles;
  iterator __end1_5;
  iterator __begin1_5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>_>
  *__range1_5;
  string local_af0;
  allocator<char> local_ac9;
  key_type local_ac8;
  undefined1 local_aa8 [8];
  ScanningFiles files;
  key_type local_a60;
  string local_a40;
  string local_a20;
  basic_string_view<char,_std::char_traits<char>_> local_a00;
  basic_string_view<char,_std::char_traits<char>_> local_9f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_9e0;
  cmFileSet *local_9d0;
  cmFileSet *fs;
  cmSourceFile *sf_4;
  iterator __end1_4;
  iterator __begin1_4;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range1_4;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  cmSourceFile *sf_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1_3;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> bmiOnlySources;
  string local_950;
  cmSourceFile *local_930;
  cmSourceFile *sf_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1_2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> swiftSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8d8;
  const_iterator local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8b8;
  const_iterator local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_898;
  cmGlobalNinjaGenerator *local_890;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_888;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_880;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_878;
  string local_870;
  string local_850;
  pointer *local_830;
  cmNinjaDeps *orderOnlyDepsPrivate;
  string local_820;
  undefined1 local_800 [8];
  cmNinjaBuild buildPrivate;
  char local_6b9;
  string local_6b8;
  undefined1 local_698 [8];
  string tgtDir;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_670;
  const_iterator local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_660;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_658;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_650;
  const_iterator local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_640;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_638;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_630;
  cmGlobalNinjaGenerator *local_628;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_620;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_618;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_610;
  pointer *local_608;
  cmNinjaDeps *orderOnlyDeps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5f8;
  bool local_5ea;
  bool local_5e9;
  bool isIncludeable;
  cmFileSet *pcStack_5e8;
  bool isVisible;
  cmFileSet *fileset;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5d8;
  iterator it;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5b8;
  const_iterator local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_598;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_590;
  const_iterator local_588;
  size_type local_580;
  size_type nPreviousOutputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ccbyproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ccoutputs;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_548;
  string local_520;
  undefined1 local_500 [8];
  cmCustomCommandGenerator ccg;
  cmCustomCommand *cc_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_> *__range1_1;
  undefined1 local_378 [7];
  bool usePrivateGeneratedSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ccouts_private;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ccouts;
  string local_328;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  undefined1 local_2c0 [8];
  cmNinjaBuild build;
  string objectDir;
  undefined1 local_168 [8];
  string objectFileName;
  cmSourceFile *sf_1;
  iterator __end2;
  iterator __begin2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  string local_108;
  cmValue local_e8;
  cmValue pchExtension;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  cmCustomCommand *cc;
  cmSourceFile *sf;
  iterator __end1;
  iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommandSources;
  vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_> customCommands;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool firstForConfig_local;
  string *fileConfig_local;
  string *config_local;
  cmNinjaTargetGenerator *this_local;
  
  local_21 = firstForConfig;
  psStack_20 = fileConfig;
  fileConfig_local = config;
  config_local = (string *)this;
  cmGeneratorTarget::CheckCxxModuleStatus
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config);
  pcVar6 = GetImplFileStream(this,psStack_20);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar6);
  pcVar6 = GetImplFileStream(this,psStack_20);
  poVar7 = std::operator<<((ostream *)pcVar6,"# Object build statements for ");
  pcVar8 = GetGeneratorTarget(this);
  targetType = cmGeneratorTarget::GetType(pcVar8);
  psVar9 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  poVar7 = std::operator<<(poVar7,(string *)psVar9);
  poVar7 = std::operator<<(poVar7," target ");
  GetTargetName_abi_cxx11_(&local_48,this);
  poVar7 = std::operator<<(poVar7,(string *)&local_48);
  std::operator<<(poVar7,"\n\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::vector
            ((vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_> *)
             &customCommandSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1);
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1,
             fileConfig_local);
  __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      &__range1);
  sf = (cmSourceFile *)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                     *)&sf), bVar2) {
    ppcVar18 = __gnu_cxx::
               __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
               ::operator*(&__end1);
    headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)cmSourceFile::GetCustomCommand(*ppcVar18);
    pcVar17 = GetLocalGenerator(this);
    cc_01 = headerSources.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    pcVar8 = GetGeneratorTarget(this);
    cmLocalNinjaGenerator::AddCustomCommandTarget(pcVar17,(cmCustomCommand *)cc_01,pcVar8);
    std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::push_back
              ((vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_> *)
               &customCommandSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type *)
               &headerSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1);
  pppcVar1 = &extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar1);
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar1,
             fileConfig_local);
  pcVar10 = std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::
            operator->(&this->OSXBundleGenerator);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](&this->Configs,psStack_20);
  pMVar12 = std::
            unique_ptr<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
            ::get(&pmVar11->MacOSXContentGenerator);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar10,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                     &extraSources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &pMVar12->super_MacOSXContentGeneratorType,fileConfig_local);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&pchExtension);
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&pchExtension,
             fileConfig_local);
  pcVar10 = std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::
            operator->(&this->OSXBundleGenerator);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](&this->Configs,psStack_20);
  pMVar12 = std::
            unique_ptr<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
            ::get(&pmVar11->MacOSXContentGenerator);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar10,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                     &pchExtension,&pMVar12->super_MacOSXContentGeneratorType,fileConfig_local);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&pchExtension);
  if ((local_21 & 1) != 0) {
    pcVar13 = GetMakefile(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"CMAKE_PCH_EXTENSION",
               (allocator<char> *)
               ((long)&externalObjects.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_e8 = cmMakefile::GetDefinition(pcVar13,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&externalObjects.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2);
    cmGeneratorTarget::GetExternalObjects
              ((this->super_cmCommonTargetGenerator).GeneratorTarget,
               (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2,
               fileConfig_local);
    __end2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &__range2);
    sf_1 = (cmSourceFile *)
           std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      &__range2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                       *)&sf_1), bVar2) {
      ppcVar18 = __gnu_cxx::
                 __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                 ::operator*(&__end2);
      objectFileName.field_2._8_8_ = *ppcVar18;
      pcVar14 = GetGlobalGenerator(this);
      psVar9 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)objectFileName.field_2._8_8_);
      psVar9 = ConvertToNinjaPath(this,psVar9);
      (*(pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
        [0x18])(local_168,pcVar14,psVar9,fileConfig_local);
      str = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_168);
      bVar2 = cmHasSuffix(str,local_e8);
      if (!bVar2) {
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                  ::operator[](&this->Configs,fileConfig_local);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pmVar11->Objects,(value_type *)local_168);
      }
      std::__cxx11::string::~string((string *)local_168);
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2);
  }
  pcVar14 = GetGlobalGenerator(this);
  bVar2 = cmGlobalNinjaGenerator::SupportsCWDDepend(pcVar14);
  if (!bVar2) {
    GetObjectFileDir((string *)((long)&build.RspFile.field_2 + 8),this,fileConfig_local);
    EnsureDirectoryExists(this,(string *)((long)&build.RspFile.field_2 + 8));
    std::__cxx11::string::~string((string *)(build.RspFile.field_2._M_local_buf + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"phony",&local_2e1);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_2c0,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  GetTargetName_abi_cxx11_(&local_328,this);
  cmStrCat<char_const(&)[29],std::__cxx11::string>
            (&local_308,(char (*) [29])"Order-only phony target for ",&local_328);
  std::__cxx11::string::operator=((string *)local_2c0,(string *)&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  OrderDependsTargetForTarget
            ((string *)
             &ccouts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this,fileConfig_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&build.Rule.field_2 + 8),
              (value_type *)
              &ccouts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &ccouts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ccouts_private.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_378);
  bVar2 = false;
  bVar3 = cmTarget::HasFileSets(((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target);
  if (bVar3) {
    pcVar8 = GetGeneratorTarget(this);
    PVar5 = cmGeneratorTarget::GetPolicyStatusCMP0154(pcVar8);
    if ((WARN < PVar5) && (PVar5 - NEW < 3)) {
      bVar2 = true;
    }
  }
  pppcVar1 = &customCommandSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_1 = std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::begin
                       ((vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_> *
                        )pppcVar1);
  cc_1 = (cmCustomCommand *)
         std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::end
                   ((vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_> *)
                    pppcVar1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_cmCustomCommand_**,_std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>_>
                             *)&cc_1), bVar3) {
    ppcVar15 = __gnu_cxx::
               __normal_iterator<const_cmCustomCommand_**,_std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>_>
               ::operator*(&__end1_1);
    cc_00 = *ppcVar15;
    ccg.ComputeInternalDepfile._M_invoker = (_Invoker_type)cc_00;
    std::__cxx11::string::string((string *)&local_520,(string *)fileConfig_local);
    pcVar17 = GetLocalGenerator(this);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_548);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&ccoutputs);
    cmCustomCommandGenerator::cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)local_500,cc_00,&local_520,(cmLocalGenerator *)pcVar17,
               true,&local_548,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&ccoutputs);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)&ccoutputs);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_548);
    std::__cxx11::string::~string((string *)&local_520);
    ccbyproducts = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                             ((cmCustomCommandGenerator *)local_500);
    nPreviousOutputs =
         (size_type)
         cmCustomCommandGenerator::GetByproducts_abi_cxx11_((cmCustomCommandGenerator *)local_500);
    ppbVar22 = &ccouts_private.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_580 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ppbVar22);
    local_590._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar22);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_588,&local_590);
    local_598._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(ccbyproducts);
    local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(ccbyproducts);
    local_5a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           ppbVar22,local_588,local_598,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_5a0);
    ppbVar22 = &ccouts_private.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_5b8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar22);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_5b0,&local_5b8);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)nPreviousOutputs);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)nPreviousOutputs);
    it = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
         insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                   ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ppbVar22,
                    local_5b0,__first._M_current,__last._M_current);
    if (bVar2) {
      local_5d8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ccouts_private.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      advance<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,unsigned_long>
                (&local_5d8,local_580);
      while( true ) {
        fileset = (cmFileSet *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&ccouts_private.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar3 = __gnu_cxx::operator!=
                          (&local_5d8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&fileset);
        psVar9 = fileConfig_local;
        if (!bVar3) break;
        pcVar8 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
        pcVar13 = (this->super_cmCommonTargetGenerator).Makefile;
        pbVar16 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_5d8);
        sf_00 = cmMakefile::GetOrCreateGeneratedSource(pcVar13,pbVar16);
        pcStack_5e8 = cmGeneratorTarget::GetFileSetForSource(pcVar8,psVar9,sf_00);
        local_f79 = false;
        if (pcStack_5e8 != (cmFileSet *)0x0) {
          vis = cmFileSet::GetVisibility(pcStack_5e8);
          local_f79 = cmFileSetVisibilityIsForInterface(vis);
        }
        local_5e9 = local_f79;
        local_f82 = true;
        if (pcStack_5e8 != (cmFileSet *)0x0) {
          psVar9 = cmFileSet::GetType_abi_cxx11_(pcStack_5e8);
          local_f82 = cmFileSetTypeCanBeIncluded(psVar9);
        }
        local_5ea = local_f82;
        if (((pcStack_5e8 == (cmFileSet *)0x0) || ((local_5e9 & 1U) == 0)) || (local_f82 == false))
        {
          if ((pcStack_5e8 == (cmFileSet *)0x0) || (local_f82 != false)) {
            pbVar16 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_5d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_378,pbVar16);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&orderOnlyDeps,&local_5d8);
          local_5f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&ccouts_private.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (const_iterator)orderOnlyDeps);
          local_5d8._M_current = local_5f8;
        }
        else {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_5d8);
        }
      }
    }
    cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_500);
    __gnu_cxx::
    __normal_iterator<const_cmCustomCommand_**,_std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>_>
    ::operator++(&__end1_1);
  }
  local_608 = &build.ImplicitDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar17 = GetLocalGenerator(this);
  cmLocalNinjaGenerator::AppendTargetDepends
            (pcVar17,(this->super_cmCommonTargetGenerator).GeneratorTarget,(cmNinjaDeps *)local_608,
             fileConfig_local,psStack_20,DependOnTargetOrdering);
  ppbVar22 = local_608;
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](&this->Configs,fileConfig_local);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ppbVar22,&pmVar11->ExtraFiles);
  ppbVar22 = &ccouts_private.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_610._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar22);
  local_618._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ppbVar22);
  local_620 = std::
              back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_608);
  local_628 = (cmGlobalNinjaGenerator *)MapToNinjaPath(this);
  local_630 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)std::
                 transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                           (local_610,local_618,local_620,(MapToNinjaPathImpl)local_628);
  local_638._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_608);
  local_640 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_608);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (local_638,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_640);
  ppbVar22 = local_608;
  local_658._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_608);
  local_660 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_608);
  local_650 = std::
              unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (local_658,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_660);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_648,&local_650);
  local_670._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_608);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_668,&local_670);
  tgtDir.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar22,local_648,local_668);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_608);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_698);
    pcVar14 = GetGlobalGenerator(this);
    bVar2 = cmGlobalNinjaGenerator::SupportsCWDDepend(pcVar14);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)local_698,".");
    }
    else {
      psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                         ((cmLocalGenerator *)this->LocalGenerator);
      local_6b9 = '/';
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        super_cmOutputConverter._vptr_cmOutputConverter[0x10])
                ((undefined1 *)((long)&buildPrivate.RspFile.field_2 + 8),this->LocalGenerator,
                 (this->super_cmCommonTargetGenerator).GeneratorTarget);
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
                (&local_6b8,psVar9,&local_6b9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&buildPrivate.RspFile.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_698,(string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)(buildPrivate.RspFile.field_2._M_local_buf + 8));
    }
    ppbVar22 = local_608;
    psVar9 = ConvertToNinjaPath(this,(string *)local_698);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)ppbVar22,psVar9);
    std::__cxx11::string::~string((string *)local_698);
  }
  pcVar14 = GetGlobalGenerator(this);
  pcVar6 = GetImplFileStream(this,psStack_20);
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar14,(ostream *)pcVar6,(cmNinjaBuild *)local_2c0,0,(bool *)0x0);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_378);
  this->HasPrivateGeneratedSources = (bool)((bVar2 ^ 0xffU) & 1);
  if ((this->HasPrivateGeneratedSources & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_820,"phony",(allocator<char> *)((long)&orderOnlyDepsPrivate + 7));
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_800,&local_820);
    std::__cxx11::string::~string((string *)&local_820);
    std::allocator<char>::~allocator((allocator<char> *)((long)&orderOnlyDepsPrivate + 7));
    ppbVar22 = &buildPrivate.ImplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_830 = ppbVar22;
    OrderDependsTargetForTarget(&local_850,this,fileConfig_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)ppbVar22,&local_850);
    std::__cxx11::string::~string((string *)&local_850);
    OrderDependsTargetForTargetPrivate(&local_870,this,fileConfig_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&buildPrivate.Rule.field_2 + 8),&local_870);
    std::__cxx11::string::~string((string *)&local_870);
    local_878._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_378);
    local_880._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_378);
    local_888 = std::
                back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_830);
    local_890 = (cmGlobalNinjaGenerator *)MapToNinjaPath(this);
    local_898 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                             (local_878,local_880,local_888,(MapToNinjaPathImpl)local_890);
    local_8a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_830);
    local_8a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_830);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_8a0,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_8a8);
    ppbVar22 = local_830;
    local_8c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_830);
    local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_830);
    local_8b8 = std::
                unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (local_8c0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_8c8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_8b0,&local_8b8);
    local_8d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_830);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_8d0,&local_8d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)ppbVar22,local_8b0,local_8d0);
    pcVar14 = GetGlobalGenerator(this);
    pcVar6 = GetImplFileStream(this,psStack_20);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar14,(ostream *)pcVar6,(cmNinjaBuild *)local_800,0,(bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_800);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ccouts_private.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_2c0);
  pppcVar1 = &swiftSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar1);
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar1,
             fileConfig_local);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_2);
  pppcVar1 = &swiftSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        pppcVar1);
  sf_2 = (cmSourceFile *)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar1)
  ;
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                             *)&sf_2), bVar2) {
    ppcVar18 = __gnu_cxx::
               __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
               ::operator*(&__end1_2);
    local_930 = *ppcVar18;
    bmiOnlySources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    pcVar17 = GetLocalGenerator(this);
    bVar2 = cmLocalGenerator::IsSplitSwiftBuild((cmLocalGenerator *)pcVar17);
    local_109a = false;
    if (bVar2) {
      cmSourceFile::GetLanguage_abi_cxx11_(&local_950,local_930);
      bmiOnlySources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      local_109a = std::operator==(&local_950,"Swift");
    }
    if ((bmiOnlySources.
         super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_950);
    }
    if (local_109a == false) {
      WriteObjectBuildStatement(this,local_930,fileConfig_local,psStack_20,(bool)(local_21 & 1));
    }
    else {
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::push_back
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_2,
                 &local_930);
    }
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1_2);
  }
  WriteSwiftObjectBuildStatement
            (this,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_2
             ,fileConfig_local,psStack_20,(bool)(local_21 & 1));
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_2);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &swiftSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_3);
  cmGeneratorTarget::GetCxxModuleSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_3,
             fileConfig_local);
  __end1_3 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &__range1_3);
  sf_3 = (cmSourceFile *)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                    &__range1_3);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                             *)&sf_3), bVar2) {
    ppcVar18 = __gnu_cxx::
               __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
               ::operator*(&__end1_3);
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar18;
    WriteCxxModuleBmiBuildStatement
              (this,(cmSourceFile *)
                    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,fileConfig_local,psStack_20,
               (bool)(local_21 & 1));
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1_3);
  }
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_3);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1_4);
  cmGeneratorTarget::GetSourceFiles
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1_4,fileConfig_local
            );
  __end1_4 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1_4);
  sf_4 = (cmSourceFile *)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1_4);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_4,
                       (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                        *)&sf_4);
    if (!bVar2) break;
    ppcVar19 = __gnu_cxx::
               __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
               ::operator*(&__end1_4);
    fs = (cmFileSet *)*ppcVar19;
    local_9d0 = cmGeneratorTarget::GetFileSetForSource
                          ((this->super_cmCommonTargetGenerator).GeneratorTarget,fileConfig_local,
                           (cmSourceFile *)fs);
    if (local_9d0 != (cmFileSet *)0x0) {
      psVar9 = cmFileSet::GetType_abi_cxx11_(local_9d0);
      _Var23 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
      local_9e0 = _Var23;
      __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CXX_MODULES",0xb)
      ;
      local_a00 = __y;
      local_9f0 = __y;
      bVar2 = std::operator!=(local_9e0,__y);
      if (!bVar2) {
        cmSourceFile::GetLanguage_abi_cxx11_(&local_a20,(cmSourceFile *)fs);
        bVar4 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_a20);
        if ((bVar4 & 1) != 0) {
          pcVar8 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
          pcVar13 = pcVar8->Makefile;
          psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar8);
          args_1 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)fs);
          cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[21],std::__cxx11::string_const&,char_const(&)[75]>
                    (&local_a40,(char (*) [9])0x111a0b9,psVar9,
                     (char (*) [21])"\" has source file\n  ",args_1,
                     (char (*) [75])
                     "\nin a \"FILE_SET TYPE CXX_MODULES\" but it is not scheduled for compilation."
                    );
          cmMakefile::IssueMessage(pcVar13,FATAL_ERROR,&local_a40);
          std::__cxx11::string::~string((string *)&local_a40);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&__end1_4);
  }
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1_4);
  files.ModuleMapFile.field_2._M_local_buf[0xe] = '\0';
  files.ModuleMapFile.field_2._M_local_buf[0xd] = '\0';
  bVar3 = cmGeneratorTarget::HaveFortranSources
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget,fileConfig_local);
  bVar2 = false;
  if (bVar3) {
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
              ::operator[](&this->Configs,fileConfig_local);
    std::allocator<char>::allocator();
    files.ModuleMapFile.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a60,"Fortran",
               (allocator<char> *)(files.ModuleMapFile.field_2._M_local_buf + 0xf));
    files.ModuleMapFile.field_2._M_local_buf[0xd] = '\x01';
    sVar20 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>_>
             ::count(&pmVar11->ScanningInfo,&local_a60);
    bVar2 = sVar20 == 0;
  }
  if ((files.ModuleMapFile.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_a60);
  }
  if ((files.ModuleMapFile.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)(files.ModuleMapFile.field_2._M_local_buf + 0xf));
  }
  if (bVar2) {
    ScanningFiles::ScanningFiles((ScanningFiles *)local_aa8);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
              ::operator[](&this->Configs,fileConfig_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac8,"Fortran",&local_ac9);
    this_01 = (vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>_>
                 ::operator[](&pmVar11->ScanningInfo,&local_ac8);
    std::
    vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
    ::emplace_back<cmNinjaTargetGenerator::ScanningFiles&>(this_01,(ScanningFiles *)local_aa8);
    std::__cxx11::string::~string((string *)&local_ac8);
    std::allocator<char>::~allocator(&local_ac9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af0,"Fortran",(allocator<char> *)((long)&__range1_5 + 7));
    WriteCompileRule(this,&local_af0,fileConfig_local,Yes);
    std::__cxx11::string::~string((string *)&local_af0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_5 + 7));
    ScanningFiles::~ScanningFiles((ScanningFiles *)local_aa8);
  }
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](&this->Configs,fileConfig_local);
  __end1_5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>_>
             ::begin(&pmVar11->ScanningInfo);
  langScanningFiles =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>_>
          ::end(&pmVar11->ScanningInfo);
  while( true ) {
    bVar2 = std::operator!=(&__end1_5,(_Self *)&langScanningFiles);
    if (!bVar2) break;
    lang = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>
           ::operator*(&__end1_5);
    build_1.RspFile.field_2._8_8_ = &lang->second;
    LanguageDyndepRule(&local_c68,this,&lang->first,fileConfig_local);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_c48,&local_c68);
    std::__cxx11::string::~string((string *)&local_c68);
    GetDyndepFilePath(&local_c88,this,&lang->first,fileConfig_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&build_1.Rule.field_2 + 8),&local_c88);
    std::__cxx11::string::~string((string *)&local_c88);
    psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    local_ca9 = '/';
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      super_cmOutputConverter._vptr_cmOutputConverter[0x10])
              (&local_cd0,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    pcVar14 = GetGlobalGenerator(this);
    (*(pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d]
    )(&local_cf0,pcVar14,fileConfig_local);
    local_cf1 = '/';
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[13]>
              (&local_ca8,psVar9,&local_ca9,&local_cd0,&local_cf0,&local_cf1,&lang->first,
               (char (*) [13])"Modules.json");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &build_1.Outputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_ca8);
    std::__cxx11::string::~string((string *)&local_ca8);
    std::__cxx11::string::~string((string *)&local_cf0);
    std::__cxx11::string::~string((string *)&local_cd0);
    GetTargetDependInfoPath((string *)&__range2_1,this,&lang->first,fileConfig_local);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &build_1.ExplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2_1);
    std::__cxx11::string::~string((string *)&__range2_1);
    this_00 = build_1.RspFile.field_2._8_8_;
    __end2_1 = std::
               vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>
               ::begin((vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>
                        *)build_1.RspFile.field_2._8_8_);
    scanFiles = (ScanningFiles *)
                std::
                vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>
                ::end((vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>
                       *)this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_cmNinjaTargetGenerator::ScanningFiles_*,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>
                          *)&scanFiles);
      if (!bVar2) break;
      linked_directories.Forward.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           &__gnu_cxx::
            __normal_iterator<const_cmNinjaTargetGenerator::ScanningFiles_*,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>
            ::operator*(&__end2_1)->ScanningOutput;
      uVar21 = std::__cxx11::string::empty();
      if ((uVar21 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&build_1.WorkDirOuts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    linked_directories.Forward.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      uVar21 = std::__cxx11::string::empty();
      if ((uVar21 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&build_1.Outputs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    linked_directories.Forward.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      __gnu_cxx::
      __normal_iterator<const_cmNinjaTargetGenerator::ScanningFiles_*,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>
      ::operator++(&__end2_1);
    }
    WriteTargetDependInfo(this,&lang->first,fileConfig_local);
    cmCommonTargetGenerator::GetLinkedTargetDirectories
              ((LinkedTargetDirs *)&__range2_2,&this->super_cmCommonTargetGenerator,&lang->first,
               fileConfig_local);
    __end2_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2_2);
    l = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2_2);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_2,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&l);
      if (!bVar2) break;
      local_d88 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_2);
      __range2_3._7_1_ = 0x2f;
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[13]>
                (&local_da8,local_d88,(char *)((long)&__range2_3 + 7),&lang->first,
                 (char (*) [13])"Modules.json");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &build_1.ExplicitDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_da8);
      std::__cxx11::string::~string((string *)&local_da8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_2);
    }
    ppbVar22 = &linked_directories.Direct.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2_3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ppbVar22);
    l_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)ppbVar22);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_3,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&l_1);
      if (!bVar2) break;
      local_dd0 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_3);
      local_df1 = '/';
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[13]>
                (&local_df0,local_dd0,&local_df1,&lang->first,(char (*) [13])"Modules.json");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &build_1.ExplicitDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_df0);
      std::__cxx11::string::~string((string *)&local_df0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_3);
    }
    pcVar14 = GetGlobalGenerator(this);
    pcVar6 = GetImplFileStream(this,psStack_20);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar14,(ostream *)pcVar6,(cmNinjaBuild *)local_c48,0,(bool *)0x0);
    cmCommonTargetGenerator::LinkedTargetDirs::~LinkedTargetDirs((LinkedTargetDirs *)&__range2_2);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_c48);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>
    ::operator++(&__end1_5);
  }
  pcVar6 = GetImplFileStream(this,psStack_20);
  std::operator<<((ostream *)pcVar6,"\n");
  std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::~vector
            ((vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_> *)
             &customCommandSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatements(
  const std::string& config, const std::string& fileConfig,
  bool firstForConfig)
{
  this->GeneratorTarget->CheckCxxModuleStatus(config);

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetImplFileStream(fileConfig));
  this->GetImplFileStream(fileConfig)
    << "# Object build statements for "
    << cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
    << " target " << this->GetTargetName() << "\n\n";

  std::vector<cmCustomCommand const*> customCommands;
  {
    std::vector<cmSourceFile const*> customCommandSources;
    this->GeneratorTarget->GetCustomCommands(customCommandSources, config);
    for (cmSourceFile const* sf : customCommandSources) {
      cmCustomCommand const* cc = sf->GetCustomCommand();
      this->GetLocalGenerator()->AddCustomCommandTarget(
        cc, this->GetGeneratorTarget());
      customCommands.push_back(cc);
    }
  }
  {
    std::vector<cmSourceFile const*> headerSources;
    this->GeneratorTarget->GetHeaderSources(headerSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      headerSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  {
    std::vector<cmSourceFile const*> extraSources;
    this->GeneratorTarget->GetExtraSources(extraSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      extraSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  if (firstForConfig) {
    cmValue pchExtension =
      this->GetMakefile()->GetDefinition("CMAKE_PCH_EXTENSION");

    std::vector<cmSourceFile const*> externalObjects;
    this->GeneratorTarget->GetExternalObjects(externalObjects, config);
    for (cmSourceFile const* sf : externalObjects) {
      auto objectFileName = this->GetGlobalGenerator()->ExpandCFGIntDir(
        this->ConvertToNinjaPath(sf->GetFullPath()), config);
      if (!cmHasSuffix(objectFileName, pchExtension)) {
        this->Configs[config].Objects.push_back(objectFileName);
      }
    }
  }

  if (!this->GetGlobalGenerator()->SupportsCWDDepend()) {
    // Ensure that the object directory exists. If there are no objects in the
    // target (e.g., an empty `OBJECT` library), the directory is still listed
    // as an order-only depends in the build files. Alternate `ninja`
    // implementations may not allow this (such as `samu`). See #25526.
    auto const objectDir = this->GetObjectFileDir(config);
    this->EnsureDirectoryExists(objectDir);
  }

  {
    cmNinjaBuild build("phony");
    build.Comment =
      cmStrCat("Order-only phony target for ", this->GetTargetName());
    build.Outputs.push_back(this->OrderDependsTargetForTarget(config));

    // Gather order-only dependencies on custom command outputs.
    std::vector<std::string> ccouts;
    std::vector<std::string> ccouts_private;
    bool usePrivateGeneratedSources = false;
    if (this->GeneratorTarget->Target->HasFileSets()) {
      switch (this->GetGeneratorTarget()->GetPolicyStatusCMP0154()) {
        case cmPolicies::WARN:
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::NEW:
          usePrivateGeneratedSources = true;
          break;
      }
    }
    for (cmCustomCommand const* cc : customCommands) {
      cmCustomCommandGenerator ccg(*cc, config, this->GetLocalGenerator());
      const std::vector<std::string>& ccoutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccbyproducts = ccg.GetByproducts();
      auto const nPreviousOutputs = ccouts.size();
      ccouts.insert(ccouts.end(), ccoutputs.begin(), ccoutputs.end());
      ccouts.insert(ccouts.end(), ccbyproducts.begin(), ccbyproducts.end());
      if (usePrivateGeneratedSources) {
        auto it = ccouts.begin();
        // Skip over outputs that were already detected.
        std::advance(it, nPreviousOutputs);
        while (it != ccouts.end()) {
          cmFileSet const* fileset =
            this->GeneratorTarget->GetFileSetForSource(
              config, this->Makefile->GetOrCreateGeneratedSource(*it));
          bool isVisible = fileset &&
            cmFileSetVisibilityIsForInterface(fileset->GetVisibility());
          bool isIncludeable =
            !fileset || cmFileSetTypeCanBeIncluded(fileset->GetType());
          if (fileset && isVisible && isIncludeable) {
            ++it;
            continue;
          }
          if (!fileset || isIncludeable) {
            ccouts_private.push_back(*it);
          }
          it = ccouts.erase(it);
        }
      }
    }

    cmNinjaDeps& orderOnlyDeps = build.OrderOnlyDeps;
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, orderOnlyDeps, config, fileConfig,
      DependOnTargetOrdering);

    // Add order-only dependencies on other files associated with the target.
    cm::append(orderOnlyDeps, this->Configs[config].ExtraFiles);

    // Add order-only dependencies on custom command outputs.
    std::transform(ccouts.begin(), ccouts.end(),
                   std::back_inserter(orderOnlyDeps), this->MapToNinjaPath());

    std::sort(orderOnlyDeps.begin(), orderOnlyDeps.end());
    orderOnlyDeps.erase(
      std::unique(orderOnlyDeps.begin(), orderOnlyDeps.end()),
      orderOnlyDeps.end());

    // The phony target must depend on at least one input or ninja will explain
    // that "output ... of phony edge with no inputs doesn't exist" and
    // consider the phony output "dirty".
    if (orderOnlyDeps.empty()) {
      std::string tgtDir;
      if (this->GetGlobalGenerator()->SupportsCWDDepend()) {
        tgtDir = ".";
      } else {
        // Any path that always exists will work here.
        tgtDir = cmStrCat(
          this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
          this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget));
      }
      orderOnlyDeps.push_back(this->ConvertToNinjaPath(tgtDir));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);

    // Add order-only dependencies on custom command outputs that are
    // private to this target.
    this->HasPrivateGeneratedSources = !ccouts_private.empty();
    if (this->HasPrivateGeneratedSources) {
      cmNinjaBuild buildPrivate("phony");
      cmNinjaDeps& orderOnlyDepsPrivate = buildPrivate.OrderOnlyDeps;
      orderOnlyDepsPrivate.push_back(
        this->OrderDependsTargetForTarget(config));

      buildPrivate.Outputs.push_back(
        this->OrderDependsTargetForTargetPrivate(config));

      std::transform(ccouts_private.begin(), ccouts_private.end(),
                     std::back_inserter(orderOnlyDepsPrivate),
                     this->MapToNinjaPath());

      std::sort(orderOnlyDepsPrivate.begin(), orderOnlyDepsPrivate.end());
      orderOnlyDepsPrivate.erase(
        std::unique(orderOnlyDepsPrivate.begin(), orderOnlyDepsPrivate.end()),
        orderOnlyDepsPrivate.end());

      this->GetGlobalGenerator()->WriteBuild(
        this->GetImplFileStream(fileConfig), buildPrivate);
    }
  }
  {
    std::vector<cmSourceFile const*> objectSources;
    this->GeneratorTarget->GetObjectSources(objectSources, config);

    std::vector<cmSourceFile const*> swiftSources;

    for (cmSourceFile const* sf : objectSources) {
      if (this->GetLocalGenerator()->IsSplitSwiftBuild() &&
          sf->GetLanguage() == "Swift") {
        swiftSources.push_back(sf);
      } else {
        this->WriteObjectBuildStatement(sf, config, fileConfig,
                                        firstForConfig);
      }
    }
    WriteSwiftObjectBuildStatement(swiftSources, config, fileConfig,
                                   firstForConfig);
  }

  {
    std::vector<cmSourceFile const*> bmiOnlySources;
    this->GeneratorTarget->GetCxxModuleSources(bmiOnlySources, config);

    for (cmSourceFile const* sf : bmiOnlySources) {
      this->WriteCxxModuleBmiBuildStatement(sf, config, fileConfig,
                                            firstForConfig);
    }
  }

  // Detect sources in `CXX_MODULES` which are not compiled.
  {
    std::vector<cmSourceFile*> sources;
    this->GeneratorTarget->GetSourceFiles(sources, config);
    for (cmSourceFile const* sf : sources) {
      cmFileSet const* fs =
        this->GeneratorTarget->GetFileSetForSource(config, sf);
      if (!fs) {
        continue;
      }
      if (fs->GetType() != "CXX_MODULES"_s) {
        continue;
      }
      if (sf->GetLanguage().empty()) {
        this->GeneratorTarget->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Target \"", this->GeneratorTarget->GetName(),
                   "\" has source file\n  ", sf->GetFullPath(),
                   "\nin a \"FILE_SET TYPE CXX_MODULES\" but it is not "
                   "scheduled for compilation."));
      }
    }
  }

  // Check if there are Fortran objects which need to participate in forwarding
  // module requirements.
  if (this->GeneratorTarget->HaveFortranSources(config) &&
      !this->Configs[config].ScanningInfo.count("Fortran")) {
    ScanningFiles files;
    this->Configs[config].ScanningInfo["Fortran"].emplace_back(files);
    this->WriteCompileRule("Fortran", config, WithScanning::Yes);
  }

  for (auto const& langScanningFiles : this->Configs[config].ScanningInfo) {
    std::string const& language = langScanningFiles.first;
    std::vector<ScanningFiles> const& scanningFiles = langScanningFiles.second;

    cmNinjaBuild build(this->LanguageDyndepRule(language, config));
    build.Outputs.push_back(this->GetDyndepFilePath(language, config));
    build.ImplicitOuts.emplace_back(
      cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/',
               this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
               this->GetGlobalGenerator()->ConfigDirectory(config), '/',
               language, "Modules.json"));
    build.ImplicitDeps.emplace_back(
      this->GetTargetDependInfoPath(language, config));
    for (auto const& scanFiles : scanningFiles) {
      if (!scanFiles.ScanningOutput.empty()) {
        build.ExplicitDeps.push_back(scanFiles.ScanningOutput);
      }
      if (!scanFiles.ModuleMapFile.empty()) {
        build.ImplicitOuts.push_back(scanFiles.ModuleMapFile);
      }
    }

    this->WriteTargetDependInfo(language, config);

    auto const linked_directories =
      this->GetLinkedTargetDirectories(language, config);
    for (std::string const& l : linked_directories.Direct) {
      build.ImplicitDeps.emplace_back(
        cmStrCat(l, '/', language, "Modules.json"));
    }
    for (std::string const& l : linked_directories.Forward) {
      build.ImplicitDeps.emplace_back(
        cmStrCat(l, '/', language, "Modules.json"));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);
  }

  this->GetImplFileStream(fileConfig) << "\n";
}